

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall mkvmuxer::VideoTrack::VideoPayloadSize(VideoTrack *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  uVar2 = this->pixel_width_;
  if (uVar2 == 0) {
    uVar2 = this->width_;
  }
  uVar1 = EbmlElementSize(0xb0,uVar2);
  uVar2 = this->pixel_height_;
  if (uVar2 == 0) {
    uVar2 = this->height_;
  }
  uVar2 = EbmlElementSize(0xba,uVar2);
  uVar4 = uVar2 + uVar1;
  if (this->display_width_ != 0) {
    uVar2 = EbmlElementSize(0x54b0,this->display_width_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->display_height_ != 0) {
    uVar2 = EbmlElementSize(0x54ba,this->display_height_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->crop_left_ != 0) {
    uVar2 = EbmlElementSize(0x54cc,this->crop_left_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->crop_right_ != 0) {
    uVar2 = EbmlElementSize(0x54dd,this->crop_right_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->crop_top_ != 0) {
    uVar2 = EbmlElementSize(0x54bb,this->crop_top_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->crop_bottom_ != 0) {
    uVar2 = EbmlElementSize(0x54aa,this->crop_bottom_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->stereo_mode_ != 0) {
    uVar2 = EbmlElementSize(0x53b8,this->stereo_mode_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->alpha_mode_ != 0) {
    uVar2 = EbmlElementSize(0x53c0,this->alpha_mode_);
    uVar4 = uVar4 + uVar2;
  }
  if (0.0 < this->frame_rate_) {
    uVar2 = EbmlElementSize(0x2383e3,(float)this->frame_rate_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->colour_space_ != (char *)0x0) {
    uVar2 = EbmlElementSize(0x2eb524,this->colour_space_);
    uVar4 = uVar4 + uVar2;
  }
  if (this->colour_ != (Colour *)0x0) {
    uVar3 = Colour::ColourSize(this->colour_);
    uVar4 = uVar4 + uVar3;
  }
  if (this->projection_ != (Projection *)0x0) {
    uVar3 = Projection::ProjectionSize(this->projection_);
    uVar4 = uVar4 + uVar3;
  }
  return uVar4;
}

Assistant:

uint64_t VideoTrack::VideoPayloadSize() const {
  uint64_t size = EbmlElementSize(
      libwebm::kMkvPixelWidth,
      static_cast<uint64>((pixel_width_ > 0) ? pixel_width_ : width_));
  size += EbmlElementSize(
      libwebm::kMkvPixelHeight,
      static_cast<uint64>((pixel_height_ > 0) ? pixel_height_ : height_));
  if (display_width_ > 0)
    size += EbmlElementSize(libwebm::kMkvDisplayWidth,
                            static_cast<uint64>(display_width_));
  if (display_height_ > 0)
    size += EbmlElementSize(libwebm::kMkvDisplayHeight,
                            static_cast<uint64>(display_height_));
  if (crop_left_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropLeft,
                            static_cast<uint64>(crop_left_));
  if (crop_right_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropRight,
                            static_cast<uint64>(crop_right_));
  if (crop_top_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropTop,
                            static_cast<uint64>(crop_top_));
  if (crop_bottom_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropBottom,
                            static_cast<uint64>(crop_bottom_));
  if (stereo_mode_ > kMono)
    size += EbmlElementSize(libwebm::kMkvStereoMode,
                            static_cast<uint64>(stereo_mode_));
  if (alpha_mode_ > kNoAlpha)
    size += EbmlElementSize(libwebm::kMkvAlphaMode,
                            static_cast<uint64>(alpha_mode_));
  if (frame_rate_ > 0.0)
    size += EbmlElementSize(libwebm::kMkvFrameRate,
                            static_cast<float>(frame_rate_));
  if (colour_space_)
    size += EbmlElementSize(libwebm::kMkvColourSpace, colour_space_);
  if (colour_)
    size += colour_->ColourSize();
  if (projection_)
    size += projection_->ProjectionSize();

  return size;
}